

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

bool __thiscall
source::judge_file(source *this,Request *request,Response *response,CharContent *file_path)

{
  int iVar1;
  char *__file;
  bool bVar2;
  CharContent *this_00;
  stat file_stat;
  char etag_buf [200];
  CharContent local_1f0;
  CharContent local_1c8 [2];
  stat local_178 [2];
  
  __file = CharContent::c_str(file_path);
  iVar1 = stat(__file,local_178);
  if ((iVar1 < 0) || ((local_178[0].st_mode & 0xf000) != 0x4000)) {
    bVar2 = false;
  }
  else {
    CharContent::CharContent(local_1c8,&request->uri);
    this_00 = &local_1f0;
    CharContent::CharContent(this_00,file_path);
    document_iter((source *)this_00,local_1c8,response,&local_1f0);
    CharContent::~CharContent(&local_1f0);
    CharContent::~CharContent(local_1c8);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool source::judge_file(Request request,Response *response,CharContent file_path){
	struct stat file_stat;
	if(stat(file_path.c_str(),&file_stat)<0)
		return false;
	if(S_ISDIR(file_stat.st_mode)){
		return this->document_iter(request.uri,response,file_path);
	}
	else if(S_ISREG(file_stat.st_mode)){
		char etag_buf[200]={'\0'};
		snprintf(etag_buf,sizeof(etag_buf),"%lx-%lx",file_stat.st_size,file_stat.st_mtim.tv_sec);
		response->headers["ETag"]=CharContent(etag_buf);
		response->Entity=CharContent(file_stat.st_size);
		return this->file_iter(response,file_path);
	}
	return false;
}